

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<int,_3,_std::allocator<int>_>::_alloc
          (array_n<int,_3,_std::allocator<int>_> *this,uint n)

{
  int *piVar1;
  ulong __n;
  ulong uVar2;
  
  if (n == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    __n = (ulong)n;
    piVar1 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)this,__n,(void *)0x0);
    this->first = piVar1;
    for (uVar2 = 0; __n != uVar2; uVar2 = uVar2 + 1) {
      piVar1[uVar2] = 0;
    }
    this->last = piVar1 + __n;
  }
  this->_array = piVar1;
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }